

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

void __thiscall
Diligent::DescriptorPoolManager::DisposePool
          (DescriptorPoolManager *this,DescriptorPoolWrapper *Pool,Uint64 QueueMask)

{
  RenderDeviceVkImpl *pRVar1;
  CommandQueue *pCVar2;
  ulong uVar3;
  StaleResourceBase *pSVar4;
  char (*Args_1) [27];
  _func_int **pp_Var5;
  ulong uVar6;
  string msg;
  DynamicStaleResourceWrapper Wrapper;
  DescriptorPoolDeleter local_50;
  
  pRVar1 = this->m_DeviceVkImpl;
  local_50.Pool.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (Pool->m_pLogicalDevice).
         super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  local_50.Pool.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (Pool->m_pLogicalDevice).
       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (Pool->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (Pool->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_50.Pool.m_VkObject = Pool->m_VkObject;
  Pool->m_VkObject = (VkDescriptorPool_T *)0x0;
  local_50.PoolMgr = this;
  if ((pRVar1->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).m_CommandQueues == (CommandQueue *)0x0) {
    FormatString<char[99]>
              (&msg,(char (*) [99])
                    "Command queues have been destroyed. Are you releasing an object from the render device destructor?"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6b);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar3 = (pRVar1->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).m_CmdQueueCount;
  uVar6 = ~(-1L << ((byte)uVar3 & 0x3f));
  if (0x3f < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  uVar6 = uVar6 & QueueMask;
  if (uVar6 == 0) {
    FormatString<char[57]>
              (&msg,(char (*) [57])"At least one bit should be set in the command queue mask");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6f);
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    uVar3 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
    uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
    Args_1 = (char (*) [27])((uVar3 >> 4) + uVar3);
    pp_Var5 = (_func_int **)(((ulong)Args_1 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    if (pp_Var5 == (_func_int **)0x1) {
      pSVar4 = (StaleResourceBase *)::operator_new(0x28);
      pSVar4->_vptr_StaleResourceBase = (_func_int **)&PTR__SpecificStaleResource_00a54148;
      DisposePool::DescriptorPoolDeleter::DescriptorPoolDeleter
                ((DescriptorPoolDeleter *)(pSVar4 + 1),&local_50);
    }
    else {
      pSVar4 = (StaleResourceBase *)::operator_new(0x30);
      pSVar4->_vptr_StaleResourceBase = (_func_int **)&PTR__SpecificSharedStaleResource_00a54188;
      DisposePool::DescriptorPoolDeleter::DescriptorPoolDeleter
                ((DescriptorPoolDeleter *)(pSVar4 + 1),&local_50);
      pSVar4[5]._vptr_StaleResourceBase = pp_Var5;
    }
    Wrapper.m_pStaleResource = pSVar4;
    for (; uVar6 != 0; uVar6 = uVar6 & ~(1L << (uVar3 & 0x3f))) {
      uVar3 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      if ((pRVar1->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).m_CmdQueueCount <= uVar3) {
        FormatString<char[26],char[27]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x6dc2ad,Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                   ,0x7a);
        std::__cxx11::string::~string((string *)&msg);
      }
      pCVar2 = (pRVar1->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).m_CommandQueues;
      Args_1 = (char (*) [27])(uVar3 * 0x168);
      ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::SafeReleaseResource
                ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)
                 (Args_1[2] + (long)&(pCVar2->Mtx).super___mutex_base._M_mutex.__align + 2),&Wrapper
                 ,*(Uint64 *)
                   (Args_1[1] + (long)&(pCVar2->Mtx).super___mutex_base._M_mutex.__align + 0xd));
      pp_Var5 = (_func_int **)((long)pp_Var5 - 1);
    }
    if (pp_Var5 != (_func_int **)0x0) {
      FormatString<char[26],char[19]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"NumReferences == 0",
                 (char (*) [19])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SafeReleaseDeviceObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                 ,0x82);
      std::__cxx11::string::~string((string *)&msg);
    }
    Wrapper.m_pStaleResource = (StaleResourceBase *)0x0;
    DynamicStaleResourceWrapper::~DynamicStaleResourceWrapper(&Wrapper);
  }
  DisposePool::DescriptorPoolDeleter::~DescriptorPoolDeleter(&local_50);
  return;
}

Assistant:

void DescriptorPoolManager::DisposePool(VulkanUtilities::DescriptorPoolWrapper&& Pool, Uint64 QueueMask)
{
    class DescriptorPoolDeleter
    {
    public:
        // clang-format off
        DescriptorPoolDeleter(DescriptorPoolManager&                   _PoolMgr,
                              VulkanUtilities::DescriptorPoolWrapper&& _Pool) noexcept :
            PoolMgr {&_PoolMgr       },
            Pool    {std::move(_Pool)}
        {}

        DescriptorPoolDeleter            (const DescriptorPoolDeleter&) = delete;
        DescriptorPoolDeleter& operator= (const DescriptorPoolDeleter&) = delete;
        DescriptorPoolDeleter& operator= (      DescriptorPoolDeleter&&)= delete;

        DescriptorPoolDeleter(DescriptorPoolDeleter&& rhs)noexcept :
            PoolMgr {rhs.PoolMgr        },
            Pool    {std::move(rhs.Pool)}
        {
            rhs.PoolMgr = nullptr;
        }
        // clang-format on

        ~DescriptorPoolDeleter()
        {
            if (PoolMgr != nullptr)
            {
                PoolMgr->FreePool(std::move(Pool));
            }
        }

    private:
        DescriptorPoolManager*                 PoolMgr;
        VulkanUtilities::DescriptorPoolWrapper Pool;
    };

    m_DeviceVkImpl.SafeReleaseDeviceObject(DescriptorPoolDeleter{*this, std::move(Pool)}, QueueMask);
}